

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::ActionSequence<unsigned_long>::append
          (ActionSequence<unsigned_long> *this,Action<unsigned_long> *action)

{
  shared_ptr<fakeit::Destructible> destructable;
  __shared_ptr<fakeit::Destructible,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<fakeit::Destructible,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fakeit::Action<unsigned_long>,void>(local_20,action);
  std::
  vector<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
  ::insert(&this->_recordedActions,
           (this->_recordedActions).
           super__Vector_base<std::shared_ptr<fakeit::Destructible>,_std::allocator<std::shared_ptr<fakeit::Destructible>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1,(value_type *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void append(Action<R, arglist...> *action) {
            std::shared_ptr<Destructible> destructable{action};
            _recordedActions.insert(_recordedActions.end() - 1, destructable);
        }